

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O0

void __thiscall OpenMD::CubicSpline::addPoint(CubicSpline *this,RealType xp,RealType yp)

{
  vector<double,_std::allocator<double>_> *in_XMM0_Qa;
  value_type_conflict *in_XMM1_Qa;
  
  std::vector<double,_std::allocator<double>_>::push_back(in_XMM0_Qa,in_XMM1_Qa);
  std::vector<double,_std::allocator<double>_>::push_back(in_XMM0_Qa,in_XMM1_Qa);
  return;
}

Assistant:

void CubicSpline::addPoint(const RealType xp, const RealType yp) {
    x_.push_back(xp);
    y_.push_back(yp);
  }